

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_acid_blast(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int dam;
  bool bVar1;
  int iVar2;
  
  iVar2 = dice(level,0xb);
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,7);
  dam = iVar2 / 2;
  if (!bVar1) {
    dam = iVar2;
  }
  damage_old(ch,(CHAR_DATA *)vo,dam,sn,7,true);
  return;
}

Assistant:

void spell_acid_blast(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(level, 11);

	if (saves_spell(level, victim, DAM_ACID))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_ACID, true);
}